

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::LPFwriteObjective<double>
               (SPxLPBase<double> *p_lp,ostream *p_output,NameSet *p_cnames,bool writeZeroObjective)

{
  SPxSense SVar1;
  ostream *p_output_00;
  undefined1 in_CL;
  ostream *in_RSI;
  SPxLPBase<double> *in_RDI;
  DSVectorBase<double> svec;
  VectorBase<double> *obj;
  int sense;
  VectorBase<double> *vec;
  char *this;
  ostream *x;
  DSVectorBase<double> *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffc7;
  SVectorBase<double> *in_stack_ffffffffffffffc8;
  NameSet *in_stack_ffffffffffffffd0;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar2;
  
  uVar2 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  SVar1 = SPxLPBase<double>::spxSense(in_RDI);
  if (SVar1 == MINIMIZE) {
    this = "Minimize\n";
  }
  else {
    this = "Maximize\n";
  }
  x = in_RSI;
  std::operator<<(in_RSI,this);
  std::operator<<(in_RSI,"  obj: ");
  p_output_00 = (ostream *)SPxLPBase<double>::maxObj((SPxLPBase<double> *)0x1b2b80);
  VectorBase<double>::dim((VectorBase<double> *)0x1b2b8f);
  vec = (VectorBase<double> *)&stack0xffffffffffffffb8;
  DSVectorBase<double>::DSVectorBase(in_stack_ffffffffffffffa0,(int)((ulong)x >> 0x20));
  DSVectorBase<double>::operator=((DSVectorBase<double> *)this,vec);
  SVectorBase<double>::operator*=((SVectorBase<double> *)(double)SVar1,(double *)x);
  LPFwriteSVector<double>
            ((SPxLPBase<double> *)CONCAT44(uVar2,SVar1),p_output_00,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7);
  std::operator<<(in_RSI,"\n");
  DSVectorBase<double>::~DSVectorBase((DSVectorBase<double> *)this);
  return;
}

Assistant:

static void LPFwriteObjective(
   const SPxLPBase<R>& p_lp,                      ///< the LP
   std::ostream&       p_output,                  ///< output stream
   const NameSet*      p_cnames,                  ///< column names
   const bool          writeZeroObjective = false ///< write zero objective coefficients
)
{

   const int sense = p_lp.spxSense();

   p_output << ((sense == SPxLPBase<R>::MINIMIZE) ? "Minimize\n" : "Maximize\n");
   p_output << "  obj: ";

   const VectorBase<R>& obj = p_lp.maxObj();
   DSVectorBase<R> svec(obj.dim());
   svec.operator = (obj);
   svec *= R(sense);
   LPFwriteSVector(p_lp, p_output, p_cnames, svec, writeZeroObjective);
   p_output << "\n";
}